

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O3

void caxpy(int n,complex<float> ca,complex<float> *cx,int incx,complex<float> *cy,int incy)

{
  undefined8 uVar1;
  complex<float> z;
  undefined4 in_register_0000000c;
  long lVar2;
  undefined4 in_register_0000003c;
  int iVar3;
  ulong uVar4;
  int iVar5;
  float *pfVar6;
  undefined8 *puVar7;
  float in_XMM0_Da;
  float fVar8;
  float fVar9;
  float in_XMM0_Db;
  undefined8 uVar10;
  float fVar11;
  
  iVar3 = (int)cy;
  lVar2 = CONCAT44(in_register_0000000c,incx);
  if (0 < n) {
    z._M_value._4_4_ = in_register_0000003c;
    z._M_value._0_4_ = n;
    fVar8 = cabs1(z);
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      iVar5 = (int)cx;
      if (iVar3 == 1 && iVar5 == 1) {
        uVar4 = 0;
        do {
          fVar8 = *(float *)(ca._M_value + uVar4 * 8);
          fVar11 = *(float *)(ca._M_value + 4 + uVar4 * 8);
          fVar9 = in_XMM0_Da * fVar8 - in_XMM0_Db * fVar11;
          fVar8 = in_XMM0_Db * fVar8 + in_XMM0_Da * fVar11;
          uVar10 = CONCAT44(fVar8,fVar9);
          if ((NAN(fVar9)) && (uVar10 = CONCAT44(fVar8,fVar9), NAN(fVar8))) {
            uVar10 = __mulsc3(in_XMM0_Da);
          }
          uVar1 = *(undefined8 *)(lVar2 + uVar4 * 8);
          *(ulong *)(lVar2 + uVar4 * 8) =
               CONCAT44((float)((ulong)uVar1 >> 0x20) + (float)((ulong)uVar10 >> 0x20),
                        (float)uVar10 + (float)uVar1);
          uVar4 = uVar4 + 1;
        } while ((uint)n != uVar4);
      }
      else {
        puVar7 = (undefined8 *)(lVar2 + (long)(iVar3 >> 0x1f & (1 - n) * iVar3) * 8);
        pfVar6 = (float *)(ca._M_value + (long)(iVar5 >> 0x1f & (1 - n) * iVar5) * 8 + 4);
        do {
          fVar8 = in_XMM0_Da * pfVar6[-1] - in_XMM0_Db * *pfVar6;
          fVar11 = in_XMM0_Db * pfVar6[-1] + in_XMM0_Da * *pfVar6;
          uVar10 = CONCAT44(fVar11,fVar8);
          if ((NAN(fVar8)) && (uVar10 = CONCAT44(fVar11,fVar8), NAN(fVar11))) {
            uVar10 = __mulsc3(in_XMM0_Da);
          }
          *puVar7 = CONCAT44((float)((ulong)*puVar7 >> 0x20) + (float)((ulong)uVar10 >> 0x20),
                             (float)uVar10 + (float)*puVar7);
          puVar7 = puVar7 + iVar3;
          pfVar6 = pfVar6 + (long)iVar5 * 2;
          n = n + -1;
        } while (n != 0);
      }
    }
  }
  return;
}

Assistant:

void caxpy ( int n, complex <float> ca, complex <float> cx[],
  int incx, complex <float> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    CAXPY computes a constant times a vector plus a vector.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in CX and CY.
//
//    Input, complex <float> CA, the multiplier of CX.
//
//    Input, complex <float> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Input/output, complex <float> CY[], the second vector.
//    On output, CY(*) has been replaced by CY(*) + CA * CX(*).
//
//    Input, int INCY, the increment between successive entries of CY.
//
{
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( cabs1 ( ca ) == 0.0 )
  {
    return;
  }

  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      cy[iy] = cy[iy] + ca * cx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cy[i] = cy[i] + ca * cx[i];
    }

  }

  return;
}